

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_drawinfo.cpp
# Opt level: O3

void __thiscall FDrawInfo::FDrawInfo(FDrawInfo *this)

{
  undefined8 *puVar1;
  long lVar2;
  undefined8 *puVar3;
  
  memset(&this->sectorrenderflags,0,0xd0);
  lVar2 = 0x130;
  do {
    puVar3 = (undefined8 *)((long)this + lVar2 + -0x50);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)this + lVar2 + -0x40);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)this + lVar2 + -0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)this + lVar2 + -0x20);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(undefined4 *)((long)this + lVar2 + -0x10) = 0xffffffff;
    puVar3 = (undefined8 *)((long)this + lVar2 + -8);
    *puVar3 = 0;
    puVar3[1] = 0;
    lVar2 = lVar2 + 0x58;
  } while (lVar2 != 0x3f0);
  this->dldrawlists = (GLDrawList *)0x0;
  this->next = (FDrawInfo *)0x0;
  if (gl.legacyMode == true) {
    puVar3 = (undefined8 *)operator_new__(0x2c8);
    *puVar3 = 8;
    lVar2 = 0x58;
    do {
      puVar1 = (undefined8 *)((long)puVar3 + lVar2 + -0x50);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar3 + lVar2 + -0x40);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar3 + lVar2 + -0x30);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)puVar3 + lVar2 + -0x20);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined4 *)((long)puVar3 + lVar2 + -0x10) = 0xffffffff;
      puVar1 = (undefined8 *)((long)puVar3 + lVar2 + -8);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar2 = lVar2 + 0x58;
    } while (lVar2 != 0x318);
    this->dldrawlists = (GLDrawList *)(puVar3 + 1);
  }
  return;
}

Assistant:

FDrawInfo::FDrawInfo()
{
	next = NULL;
	if (gl.legacyMode)
	{
		dldrawlists = new GLDrawList[GLLDL_TYPES];
	}
}